

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

CExtKey * DecodeExtKey(string *str)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first2;
  size_type sVar3;
  size_type sVar4;
  uchar *code;
  CExtKey *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *prefix;
  CExtKey *key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CExtKey *in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined8 in_stack_ffffffffffffff60;
  int max_ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first1;
  
  max_ret = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first1._M_current = &in_RDI->nDepth;
  CExtKey::CExtKey(in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
  bVar2 = DecodeBase58Check(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,max_ret);
  if (bVar2) {
    __last1._M_current = (uchar *)Params();
    __first2._M_current =
         (uchar *)CChainParams::Base58Prefix
                            ((CChainParams *)
                             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                             (Base58Type)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff48);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff48);
    if (sVar3 == sVar4 + 0x4a) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff5f =
           std::
           equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     (__first1,__last1,__first2);
      if ((bool)in_stack_ffffffffffffff5f) {
        code = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_ffffffffffffff48);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff48);
        CExtKey::Decode((CExtKey *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                        code);
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CExtKey DecodeExtKey(const std::string& str)
{
    CExtKey key;
    std::vector<unsigned char> data;
    if (DecodeBase58Check(str, data, 78)) {
        const std::vector<unsigned char>& prefix = Params().Base58Prefix(CChainParams::EXT_SECRET_KEY);
        if (data.size() == BIP32_EXTKEY_SIZE + prefix.size() && std::equal(prefix.begin(), prefix.end(), data.begin())) {
            key.Decode(data.data() + prefix.size());
        }
    }
    return key;
}